

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Reader::readValue(Reader *this)

{
  ValueHolder VVar1;
  Location pCVar2;
  _Elt_pointer ppVVar3;
  Location pCVar4;
  bool bVar5;
  ushort uVar6;
  ulong uVar7;
  _Elt_pointer ppVVar8;
  undefined8 uVar9;
  ValueHolder *pVVar10;
  ushort uVar11;
  pointer pcVar12;
  _Elt_pointer ppVVar13;
  ValueHolder *pVVar14;
  ushort uVar15;
  pointer unaff_R12;
  Token token;
  Token local_f8;
  string local_e0;
  ValueHolder local_c0;
  ushort local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  ValueHolder local_98;
  ushort local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  ValueHolder local_70;
  ushort local_68;
  undefined8 local_60;
  ValueHolder VStack_58;
  ValueHolder local_50;
  ValueHolder local_48;
  ushort local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  skipCommentTokens(this,&local_f8);
  if ((this->collectComments_ == true) && ((this->commentsBefore_)._M_string_length != 0)) {
    uVar7 = std::__cxx11::string::find_last_not_of
                      ((char *)&this->commentsBefore_,0x12874d,0xffffffffffffffff);
    if (uVar7 == 0xffffffffffffffff) {
      (this->commentsBefore_)._M_string_length = 0;
      pcVar12 = (this->commentsBefore_)._M_dataplus._M_p;
    }
    else {
      if ((this->commentsBefore_)._M_string_length <= uVar7) {
        uVar9 = std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                           "basic_string::erase");
        if (local_e0._M_dataplus._M_p != unaff_R12) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar9);
      }
      (this->commentsBefore_)._M_string_length = uVar7 + 1;
      pcVar12 = (this->commentsBefore_)._M_dataplus._M_p + uVar7 + 1;
    }
    *pcVar12 = '\0';
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar8 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setComment(ppVVar8[-1],(this->commentsBefore_)._M_dataplus._M_p,commentBefore);
    std::__cxx11::string::_M_replace
              ((ulong)&this->commentsBefore_,0,(char *)(this->commentsBefore_)._M_string_length,
               0x1291e6);
  }
  switch(local_f8.type_) {
  case tokenObjectBegin:
    bVar5 = readObject(this,&local_f8);
    break;
  default:
switchD_0010878b_caseD_2:
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar13 = ppVVar8;
    if (ppVVar8 == ppVVar3) {
      ppVVar13 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar4 = this->begin_;
    ppVVar13[-1]->start_ = (long)local_f8.start_ - (long)pCVar4;
    if (ppVVar8 == ppVVar3) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar8[-1]->limit_ = (long)local_f8.end_ - (long)pCVar4;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"Syntax error: value, object or array expected.","");
    addError(this,&local_e0,&local_f8,(Location)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    return false;
  case tokenArrayBegin:
    bVar5 = readArray(this,&local_f8);
    break;
  case tokenString:
    bVar5 = decodeString(this,&local_f8);
    goto LAB_00108bcc;
  case tokenNumber:
    bVar5 = decodeNumber(this,&local_f8);
    goto LAB_00108bcc;
  case tokenTrue:
    uVar6 = local_90 & 0xfe00;
    local_90 = uVar6 | 5;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    local_98.bool_ = true;
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar8 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar10 = &ppVVar8[-1]->value_;
    uVar11 = *(ushort *)(pVVar10 + 1);
    uVar15 = uVar11 & 0xff00 | 5;
    *(ushort *)(pVVar10 + 1) = uVar15;
    uVar6 = uVar6 | uVar11 & 0xff;
    pVVar14 = &local_98;
    goto LAB_00108b27;
  case tokenFalse:
    uVar6 = local_b8 & 0xfe00;
    local_b8 = uVar6 | 5;
    local_b0 = 0;
    uStack_a8 = 0;
    local_a0 = 0;
    local_c0.bool_ = false;
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar8 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar10 = &ppVVar8[-1]->value_;
    uVar11 = *(ushort *)(pVVar10 + 1);
    uVar15 = uVar11 & 0xff00 | 5;
    *(ushort *)(pVVar10 + 1) = uVar15;
    uVar6 = uVar6 | uVar11 & 0xff;
    pVVar14 = &local_c0;
LAB_00108b27:
    *(ushort *)(pVVar14 + 1) = uVar6;
    VVar1 = *pVVar10;
    *pVVar10 = *pVVar14;
    *pVVar14 = VVar1;
    *(ushort *)(pVVar10 + 1) = uVar15 & 0xfe05;
    *(ushort *)(pVVar14 + 1) = uVar11 & 0x100 | uVar6;
LAB_00108b4f:
    VVar1 = pVVar10[3];
    pVVar10[3] = pVVar14[3];
    pVVar14[3] = VVar1;
    VVar1 = pVVar10[4];
    pVVar10[4] = pVVar14[4];
    pVVar14[4] = VVar1;
    Value::~Value((Value *)pVVar14);
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar13 = ppVVar8;
    if (ppVVar8 == ppVVar3) {
      ppVVar13 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar4 = this->begin_;
    ppVVar13[-1]->start_ = (long)local_f8.start_ - (long)pCVar4;
    if (ppVVar8 == ppVVar3) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar8[-1]->limit_ = (long)local_f8.end_ - (long)pCVar4;
LAB_00108bca:
    bVar5 = true;
    goto LAB_00108bcc;
  case tokenNull:
    local_38 = 0;
    uStack_30 = 0;
    local_28 = 0;
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar8 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar10 = &ppVVar8[-1]->value_;
    uVar6 = *(ushort *)(pVVar10 + 1);
    *(ushort *)(pVVar10 + 1) = uVar6 & 0xff00;
    pVVar14 = &local_48;
    VVar1 = *pVVar10;
    *pVVar10 = local_48;
    local_48 = VVar1;
    *(ushort *)(pVVar10 + 1) = uVar6 & 0xfe00;
    local_40 = uVar6 & 0x100 | local_40 & 0xfe00 | uVar6 & 0xff;
    goto LAB_00108b4f;
  case tokenArraySeparator:
    if ((this->features_).allowDroppedNullPlaceholders_ != true) goto switchD_0010878b_caseD_2;
    this->current_ = this->current_ + -1;
    local_60 = 0;
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar8 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar14 = &ppVVar8[-1]->value_;
    uVar6 = *(ushort *)(pVVar14 + 1);
    *(ushort *)(pVVar14 + 1) = uVar6 & 0xff00;
    VVar1 = *pVVar14;
    *pVVar14 = local_70;
    *(ushort *)(pVVar14 + 1) = uVar6 & 0xfe00;
    local_68 = uVar6 & 0x100 | local_68 & 0xfe00 | uVar6 & 0xff;
    VStack_58 = pVVar14[3];
    pVVar14[3].int_ = 0;
    local_50 = pVVar14[4];
    pVVar14[4].int_ = 0;
    local_70 = VVar1;
    Value::~Value((Value *)&local_70);
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar13 = ppVVar8;
    if (ppVVar8 == ppVVar3) {
      ppVVar13 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar4 = this->begin_;
    pCVar2 = this->current_;
    ppVVar13[-1]->start_ = (size_t)(pCVar2 + ~(ulong)pCVar4);
    if (ppVVar8 == ppVVar3) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar8[-1]->limit_ = (long)pCVar2 - (long)pCVar4;
    goto LAB_00108bca;
  }
  ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar8 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppVVar8[-1]->limit_ = (long)this->current_ - (long)this->begin_;
LAB_00108bcc:
  if (this->collectComments_ == true) {
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    this->lastValueEnd_ = this->current_;
    if (ppVVar8 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this->lastValue_ = ppVVar8[-1];
  }
  return bVar5;
}

Assistant:

bool Reader::readValue() {
  Token token;
  skipCommentTokens(token);
  bool successful = true;

  if (collectComments_ && !commentsBefore_.empty()) {
    // Remove newline characters at the end of the comments
    size_t lastNonNewline = commentsBefore_.find_last_not_of("\r\n");
    if (lastNonNewline != std::string::npos) {
      commentsBefore_.erase(lastNonNewline + 1);
    } else {
      commentsBefore_.clear();
    }

    currentValue().setComment(commentsBefore_, commentBefore);
    commentsBefore_ = "";
  }

  switch (token.type_) {
  case tokenObjectBegin:
    successful = readObject(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenArrayBegin:
    successful = readArray(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenNumber:
    successful = decodeNumber(token);
    break;
  case tokenString:
    successful = decodeString(token);
    break;
  case tokenTrue:
    currentValue() = true;
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    break;
  case tokenFalse:
    currentValue() = false;
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    break;
  case tokenNull:
    currentValue() = Value();
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    break;
  case tokenArraySeparator:
    if (features_.allowDroppedNullPlaceholders_) {
      // "Un-read" the current token and mark the current value as a null
      // token.
      current_--;
      currentValue() = Value();
      currentValue().setOffsetStart(current_ - begin_ - 1);
      currentValue().setOffsetLimit(current_ - begin_);
      break;
    }
  // Else, fall through...
  default:
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    return addError("Syntax error: value, object or array expected.", token);
  }

  if (collectComments_) {
    lastValueEnd_ = current_;
    lastValue_ = &currentValue();
  }

  return successful;
}